

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

xmlListPtr xmlListDup(xmlListPtr old)

{
  int iVar1;
  xmlListPtr cur;
  xmlListPtr old_local;
  
  if (old == (xmlListPtr)0x0) {
    old_local = (xmlListPtr)0x0;
  }
  else {
    old_local = xmlListCreate((xmlListDeallocator)0x0,old->linkCompare);
    if (old_local == (xmlListPtr)0x0) {
      old_local = (xmlListPtr)0x0;
    }
    else {
      iVar1 = xmlListCopy(old_local,old);
      if (iVar1 != 0) {
        old_local = (xmlListPtr)0x0;
      }
    }
  }
  return old_local;
}

Assistant:

xmlListPtr
xmlListDup(const xmlListPtr old)
{
    xmlListPtr cur;

    if (old == NULL)
        return(NULL);
    /* Hmmm, how to best deal with allocation issues when copying
     * lists. If there is a de-allocator, should responsibility lie with
     * the new list or the old list. Surely not both. I'll arbitrarily
     * set it to be the old list for the time being whilst I work out
     * the answer
     */
    if (NULL ==(cur = xmlListCreate(NULL, old->linkCompare)))
        return (NULL);
    if (0 != xmlListCopy(cur, old))
        return NULL;
    return cur;
}